

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::
SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
::push_back(SmallVectorTemplateBase<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_false>
            *this,InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                  *Elt)

{
  void **ppvVar1;
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
  *this_00;
  
  if ((this->
      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
      ).super_SmallVectorBase.CapacityX <=
      (this->
      super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
      ).super_SmallVectorBase.EndX) {
    grow(this,0);
  }
  this_00 = (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
             *)(this->
               super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
               ).super_SmallVectorBase.EndX;
  meta::impl::
  tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
  ::tuple_base(this_00,(tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL>,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_Fixpp::Field<Fixpp::TagT<459U,_Fixpp::Type::String>_>_>
                        *)Elt);
  this_00[1].super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>.
  value.val_._M_string_length =
       (Elt->
       super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
       ).allBits.super__Base_bitset<1UL>._M_w;
  SmallVector<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_10U>
  ::SmallVector((SmallVector<Fixpp::MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>::Unparsed,_10U>
                 *)&this_00[1].
                    super_tuple_value<0UL,_Fixpp::Field<Fixpp::TagT<458U,_Fixpp::Type::String>_>,_false>
                    .value.val_.field_2,
                &(Elt->
                 super_MessageBase<Fixpp::Field,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>
                 ).unparsed);
  ppvVar1 = &(this->
             super_SmallVectorTemplateCommon<Fixpp::InstanceGroup<Fixpp::SmallRepeatingGroup<Fixpp::TagT<457U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<458U,_Fixpp::Type::String>,_Fixpp::TagT<459U,_Fixpp::Type::String>_>_>,_void>
             ).super_SmallVectorBase.EndX;
  *ppvVar1 = (void *)((long)*ppvVar1 + 0x168);
  return;
}

Assistant:

void push_back(const T &Elt) {
    if (LLVM_UNLIKELY(this->EndX >= this->CapacityX))
      this->grow();
    ::new ((void*) this->end()) T(Elt);
    this->setEnd(this->end()+1);
  }